

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

int gpointer_check(t_gpointer *gp,int headok)

{
  t_gstub *ptVar1;
  long lVar2;
  
  ptVar1 = gp->gp_stub;
  if (ptVar1 == (t_gstub *)0x0) {
    return 0;
  }
  if (ptVar1->gs_which == 2) {
    lVar2 = 0x18;
  }
  else {
    if (ptVar1->gs_which != 1) {
      return 0;
    }
    lVar2 = 0x40;
    if ((headok == 0) && ((gp->gp_un).gp_scalar == (_scalar *)0x0)) {
      return 0;
    }
  }
  return (int)(*(int *)((long)&(((ptVar1->gs_un).gs_glist)->gl_obj).te_g.g_pd + lVar2) ==
              gp->gp_valid);
}

Assistant:

int gpointer_check(const t_gpointer *gp, int headok)
{
    t_gstub *gs = gp->gp_stub;
    if (!gs) return (0);
    if (gs->gs_which == GP_ARRAY)
    {
        if (gs->gs_un.gs_array->a_valid != gp->gp_valid) return (0);
        else return (1);
    }
    else if (gs->gs_which == GP_GLIST)
    {
        if (!headok && !gp->gp_un.gp_scalar) return (0);
        else if (gs->gs_un.gs_glist->gl_valid != gp->gp_valid) return (0);
        else return (1);
    }
    else return (0);
}